

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O3

void __thiscall
TPZManVector<TPZEqnArray<std::complex<long_double>_>,_10>::Resize
          (TPZManVector<TPZEqnArray<std::complex<long_double>_>,_10> *this,int64_t newsize,
          TPZEqnArray<std::complex<long_double>_> *object)

{
  undefined8 *puVar1;
  undefined1 auVar2 [16];
  void *pvVar3;
  ulong uVar4;
  long lVar5;
  TPZVec<TPZEqnArray<std::complex<long_double>_>_> *pTVar6;
  long lVar7;
  void *pvVar8;
  ulong uVar9;
  TPZEqnArray<std::complex<long_double>_> *pTVar10;
  double dVar11;
  
  if (newsize < 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"TManVec::Resize. Bad parameter newsize.",0x27);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + ' ');
    std::ostream::put(' ');
    std::ostream::flush();
    std::ostream::flush();
    return;
  }
  lVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
  if (newsize != lVar5) {
    lVar7 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc;
    if (lVar7 < newsize) {
      if ((ulong)newsize < 0xb) {
        if (lVar5 < 1) {
          lVar5 = 0;
        }
        else {
          lVar7 = 0;
          lVar5 = 0;
          do {
            pTVar10 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore;
            puVar1 = (undefined8 *)
                     ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x28);
            *(undefined8 *)(&this->field_0x20 + lVar7) = *puVar1;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(&this->field_0x28 + lVar7),
                       (TPZManVector<int,_100> *)(puVar1 + 1));
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)(&this->field_0x1d8 + lVar7),
                       (TPZManVector<int,_100> *)
                       ((long)(pTVar10->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar7 + -0x20));
            TPZManVector<std::complex<long_double>,_1000>::operator=
                      ((TPZManVector<std::complex<long_double>,_1000> *)(&this->field_0x390 + lVar7)
                       ,(TPZManVector<std::complex<long_double>,_1000> *)
                        ((long)&(((TPZManVector<std::complex<long_double>,_1000> *)
                                 ((pTVar10->fEqValues).
                                  super_TPZManVector<std::complex<long_double>,_1000>.fExtAlloc + -1
                                 ))->super_TPZVec<std::complex<long_double>_>)._vptr_TPZVec + lVar7)
                      );
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)(&this->field_0x80b0 + lVar7),
                       (TPZManVector<int,_1000> *)
                       ((long)(pTVar10->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar7 + -0x20));
            *(undefined4 *)(&this->field_0x9070 + lVar7) =
                 *(undefined4 *)((long)&pTVar10->fLastTerm + lVar7);
            lVar5 = lVar5 + 1;
            lVar7 = lVar7 + 0x9060;
          } while (lVar5 < (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements
                  );
        }
        lVar7 = newsize - lVar5;
        if (lVar7 != 0 && lVar5 <= newsize) {
          pTVar6 = &this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_> + lVar5 * 0x483;
          do {
            pTVar6[1]._vptr_TPZVec = *(undefined8 *)object;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)(pTVar6 + 1) + 8),
                       &(object->fEqStart).super_TPZManVector<int,_100>);
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)(pTVar6 + 0xe) + 0x18),
                       &(object->fEqNumber).super_TPZManVector<int,_100>);
            TPZManVector<std::complex<long_double>,_1000>::operator=
                      ((TPZManVector<std::complex<long_double>,_1000> *)
                       ((long)(pTVar6 + 0x1c) + 0x10),
                       &(object->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>);
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)((long)(pTVar6 + 0x405) + 0x10),
                       &(object->fIndex).super_TPZManVector<int,_1000>);
            *(int *)((long)(pTVar6 + 0x483) + 0x10) = object->fLastTerm;
            pTVar6 = pTVar6 + 0x483;
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pTVar10 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore;
        if (pTVar10 != (TPZEqnArray<std::complex<long_double>_> *)0x0 &&
            pTVar10 != (TPZEqnArray<std::complex<long_double>_> *)&this->field_0x20) {
          lVar5 = *(long *)&pTVar10[-1].field_0x9058;
          if (lVar5 != 0) {
            lVar7 = lVar5 * 0x9060;
            do {
              TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray
                        ((TPZEqnArray<std::complex<long_double>_> *)
                         ((long)pTVar10[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                         lVar7 + -0x28));
              lVar7 = lVar7 + -0x9060;
            } while (lVar7 != 0);
          }
          operator_delete__(&pTVar10[-1].fLastTerm,lVar5 * 0x9060 | 0x10);
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore =
             (TPZEqnArray<std::complex<long_double>_> *)&this->field_0x20;
        (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc = 10;
      }
      else {
        dVar11 = (double)lVar7 * 1.2;
        uVar9 = (long)dVar11;
        if (dVar11 < (double)newsize) {
          uVar9 = newsize;
        }
        auVar2._8_8_ = 0;
        auVar2._0_8_ = uVar9;
        uVar4 = 0xffffffffffffffff;
        if (SUB168(auVar2 * ZEXT816(0x9060),8) == 0) {
          uVar4 = SUB168(auVar2 * ZEXT816(0x9060),0) | 0x10;
        }
        pvVar3 = operator_new__(uVar4);
        *(ulong *)((long)pvVar3 + 8) = uVar9;
        if (uVar9 != 0) {
          lVar5 = 0;
          pTVar10 = (TPZEqnArray<std::complex<long_double>_> *)((long)pvVar3 + 0x10);
          do {
            TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(pTVar10);
            lVar5 = lVar5 + -0x9060;
            pTVar10 = pTVar10 + 1;
          } while (uVar9 * -0x9060 - lVar5 != 0);
          lVar5 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements;
        }
        if (lVar5 < 1) {
          lVar5 = 0;
        }
        else {
          lVar7 = 0;
          lVar5 = 0;
          do {
            pTVar10 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore;
            puVar1 = (undefined8 *)
                     ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar7 + -0x28);
            *(undefined8 *)((long)pvVar3 + lVar7 + 0x10) = *puVar1;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar3 + lVar7 + 0x18),
                       (TPZManVector<int,_100> *)(puVar1 + 1));
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar3 + lVar7 + 0x1c8),
                       (TPZManVector<int,_100> *)
                       ((long)(pTVar10->fEqNumber).super_TPZManVector<int,_100>.fExtAlloc +
                       lVar7 + -0x20));
            TPZManVector<std::complex<long_double>,_1000>::operator=
                      ((TPZManVector<std::complex<long_double>,_1000> *)
                       ((long)pvVar3 + lVar7 + 0x380),
                       (TPZManVector<std::complex<long_double>,_1000> *)
                       ((long)&(((TPZManVector<std::complex<long_double>,_1000> *)
                                ((pTVar10->fEqValues).
                                 super_TPZManVector<std::complex<long_double>,_1000>.fExtAlloc + -1)
                                )->super_TPZVec<std::complex<long_double>_>)._vptr_TPZVec + lVar7));
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)((long)pvVar3 + lVar7 + 0x80a0),
                       (TPZManVector<int,_1000> *)
                       ((long)(pTVar10->fIndex).super_TPZManVector<int,_1000>.fExtAlloc +
                       lVar7 + -0x20));
            *(undefined4 *)((long)pvVar3 + lVar7 + 0x9060) =
                 *(undefined4 *)((long)&pTVar10->fLastTerm + lVar7);
            lVar5 = lVar5 + 1;
            lVar7 = lVar7 + 0x9060;
          } while (lVar5 < (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements
                  );
        }
        lVar7 = newsize - lVar5;
        if (lVar7 != 0 && lVar5 <= newsize) {
          pvVar8 = (void *)((long)pvVar3 + lVar5 * 0x9060);
          do {
            *(undefined8 *)((long)pvVar8 + 0x10) = *(undefined8 *)object;
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar8 + 0x18),
                       &(object->fEqStart).super_TPZManVector<int,_100>);
            TPZManVector<int,_100>::operator=
                      ((TPZManVector<int,_100> *)((long)pvVar8 + 0x1c8),
                       &(object->fEqNumber).super_TPZManVector<int,_100>);
            TPZManVector<std::complex<long_double>,_1000>::operator=
                      ((TPZManVector<std::complex<long_double>,_1000> *)((long)pvVar8 + 0x380),
                       &(object->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>);
            TPZManVector<int,_1000>::operator=
                      ((TPZManVector<int,_1000> *)((long)pvVar8 + 0x80a0),
                       &(object->fIndex).super_TPZManVector<int,_1000>);
            *(int *)((long)pvVar8 + 0x9060) = object->fLastTerm;
            pvVar8 = (void *)((long)pvVar8 + 0x9060);
            lVar7 = lVar7 + -1;
          } while (lVar7 != 0);
        }
        pTVar10 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore;
        if (pTVar10 != (TPZEqnArray<std::complex<long_double>_> *)0x0 &&
            pTVar10 != (TPZEqnArray<std::complex<long_double>_> *)&this->field_0x20) {
          lVar5 = *(long *)&pTVar10[-1].field_0x9058;
          if (lVar5 != 0) {
            lVar7 = lVar5 * 0x9060;
            do {
              TPZEqnArray<std::complex<long_double>_>::~TPZEqnArray
                        ((TPZEqnArray<std::complex<long_double>_> *)
                         ((long)pTVar10[-1].fEqStart.super_TPZManVector<int,_100>.fExtAlloc +
                         lVar7 + -0x28));
              lVar7 = lVar7 + -0x9060;
            } while (lVar7 != 0);
          }
          operator_delete__(&pTVar10[-1].fLastTerm,lVar5 * 0x9060 | 0x10);
        }
        (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore =
             (TPZEqnArray<std::complex<long_double>_> *)((long)pvVar3 + 0x10);
        (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = newsize;
        (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNAlloc = uVar9;
      }
    }
    else {
      lVar7 = newsize - lVar5;
      if (lVar7 != 0 && lVar5 <= newsize) {
        lVar5 = lVar5 * 0x9060 + 0x8090;
        do {
          pTVar10 = (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fStore;
          *(undefined8 *)((long)pTVar10 + lVar5 + -0x8090) = *(undefined8 *)object;
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pTVar10 + lVar5 + -0x8088),
                     &(object->fEqStart).super_TPZManVector<int,_100>);
          TPZManVector<int,_100>::operator=
                    ((TPZManVector<int,_100> *)((long)pTVar10 + lVar5 + -0x7ed8),
                     &(object->fEqNumber).super_TPZManVector<int,_100>);
          TPZManVector<std::complex<long_double>,_1000>::operator=
                    ((TPZManVector<std::complex<long_double>,_1000> *)
                     ((long)pTVar10 + lVar5 + -0x7d20),
                     &(object->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>);
          TPZManVector<int,_1000>::operator=
                    ((TPZManVector<int,_1000> *)
                     ((long)(pTVar10->fEqStart).super_TPZManVector<int,_100>.fExtAlloc +
                     lVar5 + -0x28),&(object->fIndex).super_TPZManVector<int,_1000>);
          *(int *)((pTVar10->fEqValues).super_TPZManVector<std::complex<long_double>,_1000>.
                   fExtAlloc[0x61]._M_value + lVar5 + 0x10) = object->fLastTerm;
          lVar5 = lVar5 + 0x9060;
          lVar7 = lVar7 + -1;
        } while (lVar7 != 0);
      }
      (this->super_TPZVec<TPZEqnArray<std::complex<long_double>_>_>).fNElements = newsize;
    }
  }
  return;
}

Assistant:

void TPZManVector< T, NumExtAlloc >::Resize(const int64_t newsize, const T& object) {
#ifndef PZNODEBUG
    if (newsize < 0) {
        PZError << "TManVec::Resize. Bad parameter newsize." << std::endl;
        PZError.flush();
        return;
    }
    if (newsize == this->fNElements)
        return;
#endif

    if (newsize <= this->fNAlloc) {
        for (int64_t i = this->fNElements; i < newsize; i++)
            this->fStore[i] = object;

        this->fNElements = newsize;
    } else if (newsize <= NumExtAlloc) { // that is, fExtAlloc != this->fStore. Moreover : this->fNElements <= this->fNAlloc
        // <= NumExtAlloc

        int64_t i;

        for (i = 0L; i < this->fNElements; i++) {
            fExtAlloc[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            fExtAlloc[i] = object;

        if (this->fStore != fExtAlloc) delete [] this->fStore;

        this->fStore = fExtAlloc;
        this->fNElements = newsize;
        this->fNAlloc = NumExtAlloc;
    } else { // the size is larger than the allocated memory, then this->fNElements
        // is always lower than newsize because fNElemets <=this->fNAllocs
        int64_t i, realsize = ExpandSize(newsize);

        T* newstore = new T[realsize];

        for (i = 0L; i < this->fNElements; i++) {
            newstore[i] = this->fStore[i];
        }

        for (; i < newsize; i++)
            newstore[i] = object;

        if (this->fStore != fExtAlloc)
            delete[]this->fStore;

        this->fStore = newstore;
        this->fNElements = newsize;
        this->fNAlloc = realsize;
    }
}